

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,vector<double,_std::allocator<double>_> *data,
          bool update,int offset,int size)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pGVar3;
  size_t __n;
  int iVar4;
  invalid_argument *piVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  pointer pGVar9;
  ulong uVar10;
  vector<float,_std::allocator<float>_> floatData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<float,_std::allocator<float>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&local_c8,
             (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&bStack_128);
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)pdVar1 - (long)pdVar2 >> 3;
  if (pdVar1 != pdVar2) {
    uVar8 = 0;
    do {
      local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = (float)pdVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < uVar10);
  }
  pGVar9 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar9 != pGVar3) {
    __n = name->_M_string_length;
    do {
      if ((pGVar9->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_0021410a:
          if (pGVar9->type == Float) {
            if (!update) {
              pGVar9->dataSize = uVar10;
            }
            if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            return;
          }
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_b0,"Tried to set GLShaderAttribute named ",name);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
          psVar7 = (size_type *)(plVar6 + 2);
          local_108._M_dataplus._M_p = (pointer)*plVar6;
          if ((size_type *)local_108._M_dataplus._M_p == psVar7) {
            local_108.field_2._M_allocated_capacity = *psVar7;
            local_108.field_2._8_8_ = plVar6[3];
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar7;
          }
          local_108._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::to_string(&local_70,pGVar9->type);
          std::operator+(&local_50,&local_108,&local_70);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar7 = (size_type *)(plVar6 + 2);
          local_e8._M_dataplus._M_p = (pointer)*plVar6;
          if ((size_type *)local_e8._M_dataplus._M_p == psVar7) {
            local_e8.field_2._M_allocated_capacity = *psVar7;
            local_e8.field_2._8_8_ = plVar6[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar7;
          }
          local_e8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_90,vsnprintf,0x3a,"%f",0x4010000000000000);
          std::operator+(&bStack_128,&local_e8,&local_90);
          std::invalid_argument::invalid_argument(piVar5,(string *)&bStack_128);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        iVar4 = bcmp((pGVar9->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
        if (iVar4 == 0) goto LAB_0021410a;
      }
      pGVar9 = pGVar9 + 1;
    } while (pGVar9 != pGVar3);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_128,"No attribute with name ",name);
  std::invalid_argument::invalid_argument(piVar5,(string *)&bStack_128);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, const std::vector<double>& data, bool update, int offset,
                                   int size) {
  // Convert input data to floats
  std::vector<float> floatData(data.size());
  for (unsigned int i = 0; i < data.size(); i++) {
    floatData[i] = static_cast<float>(data[i]);
  }

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {
      if (a.type == DataType::Float) {
        if (update) {
          // TODO: Allow modifications to non-contiguous memory
          offset *= sizeof(float);
          if (size == -1)
            size = a.dataSize * sizeof(float);
          else
            size *= sizeof(float);

        } else {
          a.dataSize = data.size();
        }
      } else {
        throw std::invalid_argument("Tried to set GLShaderAttribute named " + name +
                                    " with wrong type. Actual type: " + std::to_string(static_cast<int>(a.type)) +
                                    "  Attempted type: " + std::to_string(static_cast<float>(DataType::Float)));
      }
      return;
    }
  }

  throw std::invalid_argument("No attribute with name " + name);
}